

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseAlignOpt(WastParser *this,uint32_t *out_align)

{
  Location loc;
  TokenType TVar1;
  Result RVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined1 auStack_80 [8];
  Token token;
  
  TVar1 = Peek(this,0);
  if (TVar1 == AlignEqNat) {
    Consume((Token *)auStack_80,this);
    if (4 < token.loc.field_1.field_0.last_column - 0x5dU) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/token.h"
                    ,0x61,"const std::string &wabt::Token::text() const");
    }
    RVar2 = ParseInt32((char *)token._32_8_,
                       (char *)(token._32_8_ + (long)token.field_2.text_._M_dataplus._M_p),out_align
                       ,UnsignedOnly);
    if (RVar2.enum_ == Error) {
      loc.filename.data_._4_4_ = auStack_80._4_4_;
      loc.filename.data_._0_4_ = auStack_80._0_4_;
      loc.filename.size_._0_4_ = token.loc.filename.data_._0_4_;
      loc.filename.size_._4_4_ = token.loc.filename.data_._4_4_;
      loc.field_1.field_0.line = (undefined4)token.loc.filename.size_;
      loc.field_1.field_0.first_column = token.loc.filename.size_._4_4_;
      loc.field_1.field_0.last_column = token.loc.field_1.field_0.line;
      loc.field_1._12_4_ = token.loc.field_1.field_0.first_column;
      Error(this,loc,"invalid alignment \"%.*s\"",
            (ulong)token.field_2.text_._M_dataplus._M_p & 0xffffffff,token._32_8_,in_R8,in_R9);
    }
    if (POPCOUNT(*out_align) != 1) {
      Error(this,0x11eb407);
    }
    Token::~Token((Token *)auStack_80);
  }
  else {
    *out_align = 0xffffffff;
  }
  return TVar1 == AlignEqNat;
}

Assistant:

bool WastParser::ParseAlignOpt(uint32_t* out_align) {
  WABT_TRACE(ParseAlignOpt);
  if (PeekMatch(TokenType::AlignEqNat)) {
    Token token = Consume();
    string_view sv = token.text();
    if (Failed(ParseInt32(sv.begin(), sv.end(), out_align,
                          ParseIntType::UnsignedOnly))) {
      Error(token.loc, "invalid alignment \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    if (!IsPowerOfTwo(*out_align)) {
      Error(token.loc, "alignment must be power-of-two");
    }

    return true;
  } else {
    *out_align = WABT_USE_NATURAL_ALIGNMENT;
    return false;
  }
}